

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv__cloexec_fcntl(int fd,int set)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  while (uVar1 = fcntl(fd,1), uVar1 == 0xffffffff) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      return -*piVar3;
    }
  }
  if ((set != 0) == (bool)((byte)uVar1 & 1)) {
    return 0;
  }
  do {
    iVar2 = fcntl(fd,2,(ulong)((uint)(set != 0) | uVar1 & 0xfffffffe));
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        return 0;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  piVar3 = __errno_location();
  return -*piVar3;
}

Assistant:

int uv__cloexec_fcntl(int fd, int set) {
  int flags;
  int r;

  do
    r = fcntl(fd, F_GETFD);
  while (r == -1 && errno == EINTR);

  if (r == -1)
    return UV__ERR(errno);

  /* Bail out now if already set/clear. */
  if (!!(r & FD_CLOEXEC) == !!set)
    return 0;

  if (set)
    flags = r | FD_CLOEXEC;
  else
    flags = r & ~FD_CLOEXEC;

  do
    r = fcntl(fd, F_SETFD, flags);
  while (r == -1 && errno == EINTR);

  if (r)
    return UV__ERR(errno);

  return 0;
}